

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_ChangeVelocity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  Angle *this;
  bool bVar1;
  AActor *pAVar2;
  char *pcVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  DVector3 vel;
  double local_60;
  void *local_58;
  void *local_50;
  TVector3<double> local_40;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003e903b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e902b:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e903b:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x12c4,
                  "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar2 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar2 == (AActor *)0x0) goto LAB_003e8e29;
    bVar1 = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e903b;
    }
  }
  else {
    if (pAVar2 != (AActor *)0x0) goto LAB_003e902b;
LAB_003e8e29:
    pAVar2 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e90c9:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x12c5,
                    "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_58 = param[1].field_0.field_1.a;
LAB_003e8e79:
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e90e8:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x12c6,
                    "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_60 = param[2].field_0.f;
LAB_003e8e88:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e9098:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x12c7,
                    "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_50 = param[3].field_0.field_1.a;
LAB_003e8e9d:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e9079:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x12c8,
                    "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar4 = param[4].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e90c9;
    }
    local_58 = (void *)param[1].field_0.f;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e8e79;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e90e8;
    }
    local_60 = param[2].field_0.f;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003e8e88;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e9098;
    }
    local_50 = param[3].field_0.field_1.a;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003e8e9d;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e9079;
    }
    uVar4 = param[4].field_0.i;
    if (numparam != 5) {
      if (param[5].field_0.field_3.Type != '\0') {
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e905a;
      }
      goto LAB_003e8ec1;
    }
    param = defaultparam->Array;
  }
  if (param[5].field_0.field_3.Type != '\0') {
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e905a:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x12c9,
                  "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003e8ec1:
  pAVar2 = COPY_AAPTR(pAVar2,param[5].field_0.i);
  if (pAVar2 != (AActor *)0x0) {
    bVar1 = TVector3<double>::isZero(&pAVar2->Vel);
    local_40.X = (double)local_58;
    local_40.Y = local_60;
    local_40.Z = (double)local_50;
    this = &(pAVar2->Angles).Yaw;
    dVar5 = TAngle<double>::Sin(this);
    dVar6 = TAngle<double>::Cos(this);
    if ((uVar4 & 1) != 0) {
      local_40.X = (double)local_58 * dVar6 - local_60 * dVar5;
      local_60 = local_60 * dVar6 + (double)local_58 * dVar5;
      local_58 = (void *)local_40.X;
      local_40.Y = local_60;
    }
    if ((uVar4 & 2) == 0) {
      TVector3<double>::operator+=(&pAVar2->Vel,&local_40);
    }
    else {
      (pAVar2->Vel).Z = (double)local_50;
      (pAVar2->Vel).Y = local_60;
      (pAVar2->Vel).X = (double)local_58;
    }
    if (!bVar1) {
      CheckStopped(pAVar2);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeVelocity)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT_DEF	(x)		
	PARAM_FLOAT_DEF	(y)		
	PARAM_FLOAT_DEF	(z)		
	PARAM_INT_DEF	(flags)	
	PARAM_INT_DEF	(ptr)	

	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref == NULL)
	{
		return 0;
	}

	INTBOOL was_moving = !ref->Vel.isZero();

	DVector3 vel(x, y, z);
	double sina = ref->Angles.Yaw.Sin();
	double cosa = ref->Angles.Yaw.Cos();

	if (flags & 1)	// relative axes - make x, y relative to actor's current angle
	{
		vel.X = x*cosa - y*sina;
		vel.Y = x*sina + y*cosa;
	}
	if (flags & 2)	// discard old velocity - replace old velocity with new velocity
	{
		ref->Vel = vel;
	}
	else	// add new velocity to old velocity
	{
		ref->Vel += vel;
	}

	if (was_moving)
	{
		CheckStopped(ref);
	}
	return 0;
}